

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::GeneratedMessageReflection
          (GeneratedMessageReflection *this,Descriptor *descriptor,ReflectionSchema *schema,
          DescriptorPool *pool,MessageFactory *factory)

{
  uint32 *puVar1;
  uint32 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  (this->super_Reflection)._vptr_Reflection =
       (_func_int **)&PTR__GeneratedMessageReflection_0070ca20;
  this->descriptor_ = descriptor;
  puVar1 = schema->offsets_;
  puVar2 = schema->has_bit_indices_;
  iVar3 = schema->has_bits_offset_;
  iVar4 = schema->metadata_offset_;
  iVar5 = schema->extensions_offset_;
  iVar6 = schema->oneof_case_offset_;
  iVar7 = schema->object_size_;
  iVar8 = schema->weak_field_map_offset_;
  (this->schema_).default_instance_ = schema->default_instance_;
  (this->schema_).offsets_ = puVar1;
  (this->schema_).has_bit_indices_ = puVar2;
  (this->schema_).has_bits_offset_ = iVar3;
  (this->schema_).metadata_offset_ = iVar4;
  (this->schema_).extensions_offset_ = iVar5;
  (this->schema_).oneof_case_offset_ = iVar6;
  (this->schema_).object_size_ = iVar7;
  (this->schema_).weak_field_map_offset_ = iVar8;
  if (pool == (DescriptorPool *)0x0) {
    pool = DescriptorPool::generated_pool();
    descriptor = this->descriptor_;
  }
  this->descriptor_pool_ = pool;
  this->message_factory_ = factory;
  this->last_non_weak_field_index_ = *(int *)(descriptor + 0x2c) + -1;
  return;
}

Assistant:

GeneratedMessageReflection::GeneratedMessageReflection(
    const Descriptor* descriptor, const ReflectionSchema& schema,
    const DescriptorPool* pool, MessageFactory* factory)
    : descriptor_(descriptor),
      schema_(schema),
      descriptor_pool_((pool == NULL) ? DescriptorPool::generated_pool()
                                      : pool),
      message_factory_(factory),
      last_non_weak_field_index_(-1) {
  last_non_weak_field_index_ = descriptor_->field_count() - 1;
}